

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O2

void __thiscall
glcts::GPUShader5PreciseQualifier::drawAndGetFeedbackResult
          (GPUShader5PreciseQualifier *this,GLfloat *vertex_data_positions,
          GLfloat *vertex_data_weights,WeightedSum *feedback_result)

{
  WeightedSum WVar1;
  WeightedSum WVar2;
  WeightedSum WVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  WeightedSum *pWVar7;
  long lVar6;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_vertex_positions_buffer_id);
  (**(code **)(lVar6 + 0x150))(0x8892,0x10,vertex_data_positions,0x88e4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not set buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x171);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_vertex_weights_buffer_id);
  (**(code **)(lVar6 + 0x150))(0x8892,0x10,vertex_data_weights,0x88e4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Could not set buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x175);
  (**(code **)(lVar6 + 0x5e0))(0x8c89);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glEnable(GL_RASTERIZER_DISCARD) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x178);
  (**(code **)(lVar6 + 0x30))(0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBeginTransformFeedback(GL_POINTS) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x17b);
  (**(code **)(lVar6 + 0x538))(0,0,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Rendering Failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x17e);
  (**(code **)(lVar6 + 0x638))();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x181);
  pWVar7 = (WeightedSum *)(**(code **)(lVar6 + 0xd00))(0x8c8e,0,0x10,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x187);
  WVar1 = pWVar7[1];
  WVar2 = pWVar7[2];
  WVar3 = pWVar7[3];
  *feedback_result = *pWVar7;
  feedback_result[1] = WVar1;
  feedback_result[2] = WVar2;
  feedback_result[3] = WVar3;
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,0x18c);
  (**(code **)(lVar6 + 0x4e8))(0x8c89);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glDisable(GL_RASTERIZER_DISCARD) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5PreciseQualifier.cpp"
                  ,399);
  return;
}

Assistant:

void GPUShader5PreciseQualifier::drawAndGetFeedbackResult(const glw::GLfloat* vertex_data_positions,
														  const glw::GLfloat* vertex_data_weights,
														  WeightedSum*		  feedback_result)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_positions_buffer_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * m_n_components, vertex_data_positions, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set buffer object's data!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_weights_buffer_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * m_n_components, vertex_data_weights, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set buffer object's data!");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering Failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Fetch the results via transform feedback */
	WeightedSum* result = (WeightedSum*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0,
														  sizeof(glw::GLfloat) * m_n_components, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	memcpy(feedback_result, result, sizeof(glw::GLfloat) * m_n_components);

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");
}